

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restrict.hpp
# Opt level: O2

ssize_t __thiscall
stream::
restricted_source<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>
::read(restricted_source<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,int __fd,void *__buf,size_t __nbytes)

{
  void *pvVar1;
  ulong uVar2;
  uint64_t uVar3;
  
  if (0 < (long)__buf) {
    pvVar1 = (void *)this->remaining;
    if (pvVar1 == (void *)0x0) {
      uVar2 = 0xffffffffffffffff;
    }
    else {
      if (pvVar1 < __buf) {
        __buf = pvVar1;
      }
      uVar2 = boost::iostreams::detail::
              chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
              ::read(&this->base->
                      super_chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
                     ,__fd,__buf,__nbytes);
      if (0 < (long)uVar2) {
        uVar3 = 0;
        if (uVar2 <= this->remaining) {
          uVar3 = this->remaining - uVar2;
        }
        this->remaining = uVar3;
      }
    }
    return uVar2;
  }
  return 0;
}

Assistant:

std::streamsize read(char * buffer, std::streamsize bytes) {
		
		if(bytes <= 0) {
			return 0;
		}
		
		// Restrict the number of bytes to read
		bytes = std::streamsize(std::min(boost::uint64_t(bytes), remaining));
		if(bytes == 0) {
			return -1; // End of the restricted source reached
		}
		
		std::streamsize nread = boost::iostreams::read(base, buffer, bytes);
		
		// Remember how many bytes were read so far
		if(nread > 0) {
			remaining -= std::min(boost::uint64_t(nread), remaining);
		}
		
		return nread;
	}